

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_775ed::
HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::HilbertSort3d
          (HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>
           *this,VertexMesh *M,iterator b,iterator e,index_t limit)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  _Var1;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this->M_ = M;
  (this->m0_)._M_current = (uint *)0x0;
  (this->m1_)._M_current = (uint *)0x0;
  (this->m2_)._M_current = (uint *)0x0;
  (this->m3_)._M_current = (uint *)0x0;
  (this->m4_)._M_current = (uint *)0x0;
  (this->m5_)._M_current = (uint *)0x0;
  (this->m6_)._M_current = (uint *)0x0;
  (this->m7_)._M_current = (uint *)0x0;
  (this->m8_)._M_current = (uint *)0x0;
  if (((long)e._M_current - (long)b._M_current & 0x3fffffff8U) != 0) {
    if (((long)e._M_current - (long)b._M_current & 0x3fffff000U) == 0) {
      (anonymous_namespace)::
      HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::
      sort<0,false,false,false,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
                (M,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                    )b._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                  )e._M_current,(index_t)e._M_current);
      return;
    }
    (this->m0_)._M_current = b._M_current;
    (this->m8_)._M_current = e._M_current;
    _Var1 = (anonymous_namespace)::
            reorder_split<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,(anonymous_namespace)::Hilbert_vcmp<0,false,(anonymous_namespace)::VertexMesh>>
                      (b._M_current,e._M_current,
                       (Hilbert_vcmp<0,_false,_(anonymous_namespace)::VertexMesh>)M);
    (this->m4_)._M_current = _Var1._M_current;
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8991:3)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8991:3)>
               ::_M_manager;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8992:3)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8992:3)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    local_28._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_28,(function<void_()> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8996:3)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8996:3)>
               ::_M_manager;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8997:3)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8997:3)>
               ::_M_manager;
    local_a8._8_8_ = 0;
    local_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8998:3)>
               ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8998:3)>
               ::_M_manager;
    local_c8._8_8_ = 0;
    local_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8999:3)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8999:3)>
               ::_M_manager;
    local_c8._M_unused._M_object = this;
    local_a8._M_unused._M_object = this;
    local_88._M_unused._M_object = this;
    local_68._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_68,(function<void_()> *)&local_88,
                  (function<void_()> *)&local_a8,(function<void_()> *)&local_c8);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    local_e8._8_8_ = 0;
    local_d0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9003:3)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9003:3)>
               ::_M_manager;
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9004:3)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9004:3)>
               ::_M_manager;
    local_128._8_8_ = 0;
    local_110 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9005:3)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9005:3)>
                ::_M_manager;
    local_148._8_8_ = 0;
    local_130 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9006:3)>
                ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9006:3)>
                ::_M_manager;
    local_168._8_8_ = 0;
    local_150 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9007:3)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9007:3)>
                ::_M_manager;
    local_188._8_8_ = 0;
    local_170 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9008:3)>
                ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9008:3)>
                ::_M_manager;
    local_1a8._8_8_ = 0;
    local_190 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9009:3)>
                ::_M_invoke;
    local_198 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9009:3)>
                ::_M_manager;
    local_1c8._8_8_ = 0;
    local_1b0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9010:3)>
                ::_M_invoke;
    local_1b8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9010:3)>
                ::_M_manager;
    local_1c8._M_unused._M_object = this;
    local_1a8._M_unused._M_object = this;
    local_188._M_unused._M_object = this;
    local_168._M_unused._M_object = this;
    local_148._M_unused._M_object = this;
    local_128._M_unused._M_object = this;
    local_108._M_unused._M_object = this;
    local_e8._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_e8,(function<void_()> *)&local_108,
                  (function<void_()> *)&local_128,(function<void_()> *)&local_148,
                  (function<void_()> *)&local_168,(function<void_()> *)&local_188,
                  (function<void_()> *)&local_1a8,(function<void_()> *)&local_1c8);
    if (local_1b8 != (code *)0x0) {
      (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
    }
    if (local_198 != (code *)0x0) {
      (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
    }
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
  }
  return;
}

Assistant:

HilbertSort3d(
            const MESH& M,
            vector<index_t>::iterator b,
            vector<index_t>::iterator e,
            index_t limit = 1
        ) :
            M_(M)
        {
            geo_debug_assert(e >= b);
	    geo_cite_with_info(
		"WEB:SpatialSorting",
		"The implementation of spatial sort in GEOGRAM is inspired by "
		"the idea of using \\verb|std::nth_element()| and the recursive"
                " template in the spatial sort package of CGAL"
	    );

            // If the sequence is smaller than the limit, skip it
            if(index_t(e - b) <= limit) {
                return;
            }

            // If the sequence is smaller than 1024, use sequential sorting
            if(index_t(e - b) < 1024) {
                sort<0, false, false, false>(M_, b, e);
                return;
            }

            // Parallel sorting (2 then 4 then 8 sorts in parallel)

// Unfortunately we cannot access consts for template arguments in lambdas in all
// compilers (gcc is OK but not MSVC) so I'm using (ugly) macros here...
	    
#          define COORDX 0
#          define COORDY 1
#          define COORDZ 2
#          define UPX false
#          define UPY false
#          define UPZ false
	    
            m0_ = b;
            m8_ = e;
            m4_ = reorder_split(m0_, m8_, CMP<COORDX, UPX, MESH>(M));

	    
	    parallel(
		[this]() { m2_ = reorder_split(m0_, m4_, CMP<COORDY,  UPY, MESH>(M_)); },
		[this]() { m6_ = reorder_split(m4_, m8_, CMP<COORDY, !UPY, MESH>(M_)); }
	    );

	    parallel(
		[this]() { m1_ = reorder_split(m0_, m2_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m3_ = reorder_split(m2_, m4_, CMP<COORDZ, !UPZ, MESH>(M_)); },
		[this]() { m5_ = reorder_split(m4_, m6_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m7_ = reorder_split(m6_, m8_, CMP<COORDZ, !UPZ, MESH>(M_)); }
	    );

	    parallel(
		[this]() { sort<COORDZ,  UPZ,  UPX,  UPY>(M_, m0_, m1_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m1_, m2_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m2_, m3_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m3_, m4_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m4_, m5_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m5_, m6_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m6_, m7_); },
		[this]() { sort<COORDZ, !UPZ, !UPX,  UPY>(M_, m7_, m8_); }
	    );

#          undef COORDX
#          undef COORDY
#          undef COORDZ
#          undef UPX
#          undef UPY
#          undef UPZ	    
        }